

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool read_file(string *path,string *output)

{
  uint uVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  ifstream ifs;
  uint auStack_200 [50];
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(&ifs,(string *)path,_S_in);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(_ifs + -0x18));
  if ((uVar1 & 5) == 0) {
    std::istream::seekg((long)&ifs,_S_beg);
    std::istream::tellg();
    std::__cxx11::string::reserve((ulong)output);
    std::istream::seekg((long)&ifs,_S_beg);
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(_ifs + -0x18));
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)output,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
  }
  std::ifstream::~ifstream(&ifs);
  return (uVar1 & 5) == 0;
}

Assistant:

bool read_file(const std::string& path, std::string& output) {
  std::ifstream ifs(path);
  if(!ifs) {
    return false;
  }

  ifs.seekg(0, std::ios::end);
  output.reserve(ifs.tellg());
  ifs.seekg(0, std::ios::beg);

  output.assign((std::istreambuf_iterator<char>(ifs)), std::istreambuf_iterator<char>());
  return true;
}